

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md32_common.h
# Opt level: O1

int MD4_Update(MD4_CTX *c,void *data,size_t len)

{
  uint *data_00;
  uint uVar1;
  ulong uVar2;
  size_t __n;
  
  if (len != 0) {
    uVar1 = (int)len * 8;
    if (CARRY4(uVar1,c->Nl)) {
      c->Nh = c->Nh + 1;
    }
    c->Nh = c->Nh + (int)(len >> 0x1d);
    data_00 = c->data;
    c->Nl = uVar1 + c->Nl;
    uVar2 = (ulong)c->num;
    if (uVar2 != 0) {
      if (uVar2 + len < 0x40 && len < 0x40) {
        memcpy((void *)((long)data_00 + uVar2),data,len);
        c->num = c->num + (int)len;
        return 1;
      }
      __n = -(uVar2 - 0x40);
      if (uVar2 != 0x40) {
        memcpy((void *)(uVar2 + (long)data_00),data,__n);
      }
      md4_block_data_order(&c->A,(uint8_t *)data_00,1);
      data = (void *)((long)data + __n);
      len = len + (uVar2 - 0x40);
      c->data[0xc] = 0;
      c->data[0xd] = 0;
      c->data[0xe] = 0;
      c->data[0xf] = 0;
      c->data[8] = 0;
      c->data[9] = 0;
      c->data[10] = 0;
      c->data[0xb] = 0;
      c->data[4] = 0;
      c->data[5] = 0;
      c->data[6] = 0;
      c->data[7] = 0;
      data_00[0] = 0;
      data_00[1] = 0;
      c->data[2] = 0;
      c->data[3] = 0;
      c->num = 0;
    }
    if (0x3f < len) {
      md4_block_data_order(&c->A,(uint8_t *)data,len >> 6);
      data = (void *)((long)data + (len & 0xffffffffffffffc0));
      len = (size_t)((uint)len & 0x3f);
    }
    if (len != 0) {
      c->num = (uint)len;
      memcpy(data_00,data,len);
    }
  }
  return 1;
}

Assistant:

static inline void crypto_md32_update(crypto_md32_block_func block_func,
                                      uint32_t *h, uint8_t *data,
                                      size_t block_size, unsigned *num,
                                      uint32_t *Nh, uint32_t *Nl,
                                      const uint8_t *in, size_t len) {
  if (len == 0) {
    return;
  }

  uint32_t l = *Nl + (((uint32_t)len) << 3);
  if (l < *Nl) {
    // Handle carries.
    (*Nh)++;
  }
  *Nh += (uint32_t)(len >> 29);
  *Nl = l;

  size_t n = *num;
  if (n != 0) {
    if (len >= block_size || len + n >= block_size) {
      OPENSSL_memcpy(data + n, in, block_size - n);
      block_func(h, data, 1);
      n = block_size - n;
      in += n;
      len -= n;
      *num = 0;
      // Keep |data| zeroed when unused.
      OPENSSL_memset(data, 0, block_size);
    } else {
      OPENSSL_memcpy(data + n, in, len);
      *num += (unsigned)len;
      return;
    }
  }

  n = len / block_size;
  if (n > 0) {
    block_func(h, in, n);
    n *= block_size;
    in += n;
    len -= n;
  }

  if (len != 0) {
    *num = (unsigned)len;
    OPENSSL_memcpy(data, in, len);
  }
}